

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O3

uchar __thiscall
ImageT<unsigned_char,_1U>::swizzlePixel
          (ImageT<unsigned_char,_1U> *this,Color *srcPixel,char swizzle)

{
  int iVar1;
  undefined7 in_register_00000011;
  
  iVar1 = (int)CONCAT71(in_register_00000011,swizzle);
  if (iVar1 < 0x62) {
    if (iVar1 == 0x30) {
      return '\0';
    }
    if (iVar1 == 0x31) {
      return 0xff;
    }
    if (iVar1 == 0x61) {
LAB_00198797:
      return (srcPixel->field_0).comps[0];
    }
  }
  else if (((iVar1 == 0x62) || (iVar1 == 0x67)) || (iVar1 == 0x72)) goto LAB_00198797;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                ,0x535,
                "componentType ImageT<unsigned char, 1>::swizzlePixel(const Color &, char) [componentType = unsigned char, componentCount = 1]"
               );
}

Assistant:

componentType swizzlePixel(const Color& srcPixel, char swizzle) {
        switch (swizzle) {
          case 'r':
            return srcPixel[0];
          case 'g':
            return srcPixel[1];
          case 'b':
            return srcPixel[2];
          case 'a':
            return srcPixel[3];
          case '0':
            return componentType{0};
          case '1':
            return Color::one();
          default:
            assert(false);
            return componentType{0};
        }
    }